

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O2

void __thiscall
slang::ast::AssignmentExpression::visitExprs<slang::ast::ConstraintExprVisitor&>
          (AssignmentExpression *this,ConstraintExprVisitor *visitor)

{
  if (this->timingControl != (TimingControl *)0x0) {
    TimingControl::visit<slang::ast::ConstraintExprVisitor>(this->timingControl,visitor);
  }
  Expression::visit<slang::ast::ConstraintExprVisitor&>(this->left_,visitor);
  Expression::visit<slang::ast::ConstraintExprVisitor&>(this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        if (timingControl)
            timingControl->visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }